

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

int co_cond_timedwait(stCoCond_t *link,int ms)

{
  long lVar1;
  stCoCondItem_t *psVar2;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  int iVar3;
  stCoCondItem_t *ap;
  long *plVar4;
  void *pvVar5;
  stCoCond_t *psVar6;
  unsigned_long_long allNow;
  timeval now;
  timeval local_48;
  
  ap = (stCoCondItem_t *)calloc(1,0x58);
  plVar4 = (long *)__tls_get_addr(&PTR_00109fa8);
  lVar1 = *plVar4;
  if (lVar1 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = *(void **)(lVar1 + -8 + (long)*(int *)(lVar1 + 0x400) * 8);
  }
  (ap->timeout).pArg = pvVar5;
  (ap->timeout).pfnProcess = OnSignalProcessEvent;
  if (ms < 1) {
LAB_001069ba:
    psVar2 = link->tail;
    psVar6 = (stCoCond_t *)&psVar2->pNext;
    if (psVar2 == (stCoCondItem_t *)0x0) {
      psVar6 = link;
    }
    psVar6->head = ap;
    link->tail = ap;
    ap->pPrev = psVar2;
    ap->pNext = (stCoCondItem_t *)0x0;
    ap->pLink = link;
  }
  else {
    local_48.tv_sec = 0;
    local_48.tv_usec = 0;
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    allNow = local_48.tv_usec / 1000 + local_48.tv_sec * 1000;
    (ap->timeout).ullExpireTime = (uint)ms + allNow;
    iVar3 = AddTimeout(*(stTimeout_t **)(*(long *)(*plVar4 + 0x408) + 8),&ap->timeout,allNow);
    if (iVar3 != 0) goto LAB_00106a0d;
    if (ap->pLink == (stCoCond_t *)0x0) goto LAB_001069ba;
  }
  lVar1 = *plVar4;
  iVar3 = *(int *)(lVar1 + 0x400);
  pending_co = *(stCoRoutine_t **)(lVar1 + -0x10 + (long)iVar3 * 8);
  curr = *(stCoRoutine_t **)(lVar1 + -8 + (long)iVar3 * 8);
  *(int *)(lVar1 + 0x400) = iVar3 + -1;
  co_swap(curr,pending_co);
  RemoveFromLink<stCoCondItem_t,stCoCond_t>(ap);
  iVar3 = 0;
LAB_00106a0d:
  free(ap);
  return iVar3;
}

Assistant:

int co_cond_timedwait( stCoCond_t *link,int ms )
{
	stCoCondItem_t* psi = (stCoCondItem_t*)calloc(1, sizeof(stCoCondItem_t));
	psi->timeout.pArg = GetCurrThreadCo();
	psi->timeout.pfnProcess = OnSignalProcessEvent;

	if( ms > 0 )
	{
		unsigned long long now = GetTickMS();
		psi->timeout.ullExpireTime = now + ms;

		int ret = AddTimeout( co_get_curr_thread_env()->pEpoll->pTimeout,&psi->timeout,now );
		if( ret != 0 )
		{
			free(psi);
			return ret;
		}
	}
	AddTail( link, psi);

	co_yield_ct();


	RemoveFromLink<stCoCondItem_t,stCoCond_t>( psi );
	free(psi);

	return 0;
}